

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O0

void std_array_suite::ctor_init(void)

{
  size_type *this;
  bool bVar1;
  iterator begin;
  iterator end;
  iterator first;
  size_type length;
  undefined4 local_5c;
  size_type local_58;
  undefined4 local_4c;
  size_type local_48 [2];
  undefined1 local_38 [8];
  circular_view<int,_18446744073709551615UL> span;
  array<int,_4UL> array;
  
  span.member.next = 0x200000001;
  this = &span.member.next;
  begin = std::array<int,_4UL>::begin((array<int,_4UL> *)this);
  end = std::array<int,_4UL>::end((array<int,_4UL> *)this);
  first = std::array<int,_4UL>::begin((array<int,_4UL> *)this);
  length = std::array<int,_4UL>::size((array<int,_4UL> *)this);
  vista::circular_view<int,18446744073709551615ul>::circular_view<int*>
            ((circular_view<int,18446744073709551615ul> *)local_38,begin,end,first,length);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::empty
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  boost::detail::test_impl
            ("!span.empty()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x82a,"void std_array_suite::ctor_init()",!bVar1);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::full
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  boost::detail::test_impl
            ("span.full()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x82b,"void std_array_suite::ctor_init()",(bool)(-bVar1 & 1));
  local_48[0] = vista::circular_view<int,_18446744073709551615UL>::size
                          ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_4c = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x82c,"void std_array_suite::ctor_init()",local_48,&local_4c);
  local_58 = vista::circular_view<int,_18446744073709551615UL>::capacity
                       ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_5c = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.capacity()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x82d,"void std_array_suite::ctor_init()",&local_58,&local_5c);
  return;
}

Assistant:

void ctor_init()
{
    std::array<int, 4> array = { 1, 2, 3, 4 };
    circular_view<int> span(array.begin(), array.end(), array.begin(), array.size());
    BOOST_TEST(!span.empty());
    BOOST_TEST(span.full());
    BOOST_TEST_EQ(span.size(), 4);
    BOOST_TEST_EQ(span.capacity(), 4);
}